

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_columnref.cpp
# Opt level: O3

QualifiedColumnName *
duckdb::TransformQualifiedColumnName(QualifiedColumnName *__return_storage_ptr__,PGList *list)

{
  char *pcVar1;
  char *pcVar2;
  PGListCell *pPVar3;
  ParserException *this;
  string local_50;
  
  QualifiedColumnName::QualifiedColumnName(__return_storage_ptr__);
  switch(list->length) {
  case 1:
    goto switchD_00ca45ca_caseD_1;
  case 2:
    pcVar1 = (char *)(list->head->data).ptr_value;
    pcVar2 = (char *)(__return_storage_ptr__->table)._M_string_length;
    strlen(pcVar1);
    ::std::__cxx11::string::_M_replace((ulong)&__return_storage_ptr__->table,0,pcVar2,(ulong)pcVar1)
    ;
    list = (PGList *)list->head;
    goto switchD_00ca45ca_caseD_1;
  case 3:
    pcVar1 = (char *)(list->head->data).ptr_value;
    pcVar2 = (char *)(__return_storage_ptr__->schema)._M_string_length;
    strlen(pcVar1);
    ::std::__cxx11::string::_M_replace
              ((ulong)&__return_storage_ptr__->schema,0,pcVar2,(ulong)pcVar1);
    pcVar1 = (char *)(list->head->next->data).ptr_value;
    pcVar2 = (char *)(__return_storage_ptr__->table)._M_string_length;
    strlen(pcVar1);
    ::std::__cxx11::string::_M_replace((ulong)&__return_storage_ptr__->table,0,pcVar2,(ulong)pcVar1)
    ;
    pPVar3 = list->head;
    break;
  case 4:
    pcVar1 = (char *)(list->head->data).ptr_value;
    pcVar2 = (char *)(__return_storage_ptr__->catalog)._M_string_length;
    strlen(pcVar1);
    ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)pcVar1);
    pcVar1 = (char *)(list->head->next->data).ptr_value;
    pcVar2 = (char *)(__return_storage_ptr__->schema)._M_string_length;
    strlen(pcVar1);
    ::std::__cxx11::string::_M_replace
              ((ulong)&__return_storage_ptr__->schema,0,pcVar2,(ulong)pcVar1);
    pcVar1 = (char *)(list->head->next->next->data).ptr_value;
    pcVar2 = (char *)(__return_storage_ptr__->table)._M_string_length;
    strlen(pcVar1);
    ::std::__cxx11::string::_M_replace((ulong)&__return_storage_ptr__->table,0,pcVar2,(ulong)pcVar1)
    ;
    pPVar3 = list->head->next;
    break;
  default:
    this = (ParserException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Qualified column name must have between 1 and 4 elements","");
    ParserException::ParserException(this,&local_50);
    __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  list = (PGList *)pPVar3->next;
switchD_00ca45ca_caseD_1:
  pcVar1 = (char *)(list->head->data).ptr_value;
  pcVar2 = (char *)(__return_storage_ptr__->column)._M_string_length;
  strlen(pcVar1);
  ::std::__cxx11::string::_M_replace((ulong)&__return_storage_ptr__->column,0,pcVar2,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

QualifiedColumnName TransformQualifiedColumnName(duckdb_libpgquery::PGList &list) {
	QualifiedColumnName result;
	switch (list.length) {
	case 1:
		result.column = const_char_ptr_cast(list.head->data.ptr_value);
		break;
	case 2:
		result.table = const_char_ptr_cast(list.head->data.ptr_value);
		result.column = const_char_ptr_cast(list.head->next->data.ptr_value);
		break;
	case 3:
		result.schema = const_char_ptr_cast(list.head->data.ptr_value);
		result.table = const_char_ptr_cast(list.head->next->data.ptr_value);
		result.column = const_char_ptr_cast(list.head->next->next->data.ptr_value);
		break;
	case 4:
		result.catalog = const_char_ptr_cast(list.head->data.ptr_value);
		result.schema = const_char_ptr_cast(list.head->next->data.ptr_value);
		result.table = const_char_ptr_cast(list.head->next->next->data.ptr_value);
		result.column = const_char_ptr_cast(list.head->next->next->next->data.ptr_value);
		break;
	default:
		throw ParserException("Qualified column name must have between 1 and 4 elements");
	}
	return result;
}